

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_estimateCCtxSize(int compressionLevel)

{
  ZSTD_compressionParameters cParams;
  size_t sVar1;
  int compressionLevel_00;
  ulong uVar2;
  undefined4 in_stack_ffffffffffffff24;
  ZSTD_strategy in_stack_ffffffffffffff28;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  undefined8 uStack_c4;
  ZSTD_CCtx_params local_b8;
  
  compressionLevel_00 = 1;
  if (compressionLevel < 1) {
    compressionLevel_00 = compressionLevel;
  }
  uVar2 = 0;
  do {
    ZSTD_getCParams_internal
              ((ZSTD_compressionParameters *)&stack0xffffffffffffff28,compressionLevel_00,
               0xffffffffffffffff,0);
    cParams.chainLog = uStack_cc;
    cParams.windowLog = uStack_d0;
    cParams.hashLog = uStack_c8;
    cParams._12_8_ = uStack_c4;
    cParams.targetLength = in_stack_ffffffffffffff24;
    cParams.strategy = in_stack_ffffffffffffff28;
    ZSTD_makeCCtxParamsFromCParams(cParams);
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams(&local_b8);
    if (uVar2 < sVar1) {
      uVar2 = sVar1;
    }
    compressionLevel_00 = compressionLevel_00 + 1;
  } while (compressionLevel + 1 != compressionLevel_00);
  return uVar2;
}

Assistant:

size_t ZSTD_estimateCCtxSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        size_t const newMB = ZSTD_estimateCCtxSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}